

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

bool BLH2XYZ(BLH blh,ELLIPSOID ellipsoid,XYZ *xyz)

{
  BLH blh_00;
  ELLIPSOID ellipsoid_00;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_50;
  bool flag;
  double N;
  double cosL;
  double sinL;
  double cosB;
  double sinB;
  double L_rad;
  double B_rad;
  XYZ *xyz_local;
  
  B_rad = (double)xyz;
  L_rad = Deg2Rad(blh.B);
  sinB = Deg2Rad(blh.L);
  cosB = sin(L_rad);
  sinL = cos(L_rad);
  cosL = sin(sinB);
  N = cos(sinB);
  local_70 = blh.B;
  dStack_68 = blh.L;
  local_60 = blh.H;
  memcpy(&local_a0,&ellipsoid,0x30);
  blh_00.L = dStack_68;
  blh_00.B = local_70;
  blh_00.H = local_60;
  ellipsoid_00.b = (double)uStack_98;
  ellipsoid_00.a = (double)local_a0;
  ellipsoid_00.c = (double)local_90;
  ellipsoid_00.alpha = (double)uStack_88;
  ellipsoid_00.e2 = (double)local_80;
  ellipsoid_00.e1_2 = dStack_78;
  xyz_local._7_1_ = GetN(blh_00,ellipsoid_00,&stack0xffffffffffffffb0);
  if (xyz_local._7_1_) {
    *(double *)B_rad = (dStack_50 + blh.H) * sinL * N;
    *(double *)((long)B_rad + 8) = (dStack_50 + blh.H) * sinL * cosL;
    *(double *)((long)B_rad + 0x10) = (dStack_50 * (1.0 - ellipsoid.e2) + blh.H) * cosB;
    xyz_local._7_1_ = true;
  }
  return xyz_local._7_1_;
}

Assistant:

bool BLH2XYZ(const BLH blh, const ELLIPSOID ellipsoid, XYZ &xyz)
{
    double B_rad = Deg2Rad(blh.B);
    double L_rad = Deg2Rad(blh.L);
    double sinB = sin(B_rad);
    double cosB = cos(B_rad);
    double sinL = sin(L_rad);
    double cosL = cos(L_rad);

    double N;
    bool flag = GetN(blh, ellipsoid, N);
    if(!flag)
        return flag;
    
    xyz.X = (N + blh.H) * cosB * cosL;
    xyz.Y = (N + blh.H) * cosB * sinL;
    xyz.Z = (N * (1 - ellipsoid.e2) + blh.H) * sinB;

    return true;
}